

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_table_concat(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  TRef *pTVar2;
  uint uVar3;
  uint uVar4;
  TRef TVar5;
  TRef TVar6;
  TRef TVar7;
  undefined8 in_RAX;
  undefined4 uVar8;
  
  uVar8 = (undefined4)((ulong)in_RAX >> 0x20);
  uVar1 = *J->base;
  if ((uVar1 & 0x1f000000) == 0xb000000) {
    uVar3 = J->base[1];
    if ((uVar3 & 0x1f000000) == 0) {
      uVar3 = lj_ir_knull(J,IRT_STR);
    }
    else {
      uVar3 = lj_ir_tostr(J,uVar3);
    }
    if ((J->base[1] == 0) || (uVar4 = J->base[2], (uVar4 & 0x1f000000) == 0)) {
      uVar4 = lj_ir_kint(J,1);
    }
    else {
      uVar4 = lj_opt_narrow_toint(J,uVar4);
    }
    pTVar2 = J->base;
    if (((pTVar2[1] == 0) || (pTVar2[2] == 0)) || ((pTVar2[3] & 0x1f000000) == 0)) {
      TVar5 = lj_ir_call(J,IRCALL_lj_tab_len,(ulong)uVar1);
    }
    else {
      TVar5 = lj_opt_narrow_toint(J,pTVar2[3]);
    }
    TVar6 = lj_ir_kptr_(J,IR_KPTR,J[-1].penalty + 0x38);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x53050000;
    TVar6 = lj_opt_fold(J);
    TVar5 = lj_ir_call(J,IRCALL_lj_buf_puttab,(ulong)TVar6,(ulong)uVar1,(ulong)uVar3,(ulong)uVar4,
                       CONCAT44(uVar8,TVar5));
    TVar7 = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
    (J->fold).ins.field_0.ot = 0x989;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
    lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x5504;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
    TVar5 = lj_opt_fold(J);
    *J->base = TVar5;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_table_concat(jit_State *J, RecordFFData *rd)
{
  TRef tab = J->base[0];
  if (tref_istab(tab)) {
    TRef sep = !tref_isnil(J->base[1]) ?
	       lj_ir_tostr(J, J->base[1]) : lj_ir_knull(J, IRT_STR);
    TRef tri = (J->base[1] && !tref_isnil(J->base[2])) ?
	       lj_opt_narrow_toint(J, J->base[2]) : lj_ir_kint(J, 1);
    TRef tre = (J->base[1] && J->base[2] && !tref_isnil(J->base[3])) ?
	       lj_opt_narrow_toint(J, J->base[3]) :
	       lj_ir_call(J, IRCALL_lj_tab_len, tab);
    TRef hdr = recff_bufhdr(J);
    TRef tr = lj_ir_call(J, IRCALL_lj_buf_puttab, hdr, tab, sep, tri, tre);
    emitir(IRTG(IR_NE, IRT_PTR), tr, lj_ir_kptr(J, NULL));
    J->base[0] = emitir(IRT(IR_BUFSTR, IRT_STR), tr, hdr);
  }  /* else: Interpreter will throw. */
  UNUSED(rd);
}